

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_range_glyph_count(nk_rune *range,int count)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = (iVar1 - range[uVar2 * 2]) + range[uVar2 * 2 + 1] + 1;
  }
  return iVar1;
}

Assistant:

NK_INTERN int
nk_range_glyph_count(const nk_rune *range, int count)
{
int i = 0;
int total_glyphs = 0;
for (i = 0; i < count; ++i) {
int diff;
nk_rune f = range[(i*2)+0];
nk_rune t = range[(i*2)+1];
NK_ASSERT(t >= f);
diff = (int)((t - f) + 1);
total_glyphs += diff;
}
return total_glyphs;
}